

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::ClientHook> capnp::newBrokenCap(StringPtr reason)

{
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook> *this;
  Own<capnp::ClientHook> OVar1;
  bool local_31;
  Own<capnp::(anonymous_namespace)::BrokenClient> local_30;
  undefined1 local_20 [8];
  StringPtr reason_local;
  
  local_20 = (undefined1  [8])reason.content.size_;
  this = (Own<capnp::ClientHook> *)reason.content.ptr;
  local_31 = false;
  reason_local.content.size_ = (size_t)this;
  kj::refcounted<capnp::(anonymous_namespace)::BrokenClient,kj::StringPtr&,bool>
            ((kj *)&local_30,(StringPtr *)local_20,&local_31);
  kj::Own<capnp::ClientHook>::Own<capnp::(anonymous_namespace)::BrokenClient,void>(this,&local_30);
  kj::Own<capnp::(anonymous_namespace)::BrokenClient>::~Own(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> newBrokenCap(kj::StringPtr reason) {
  return kj::refcounted<BrokenClient>(reason, false);
}